

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.hpp
# Opt level: O1

ImageT<unsigned_char,_2U> * __thiscall
ImageT<unsigned_char,2u>::copyTo<ImageT<unsigned_char,4u>>
          (ImageT<unsigned_char,2u> *this,ImageT<unsigned_char,_4U> *dst,string_view swizzle)

{
  undefined8 uVar1;
  Color *pCVar2;
  uchar uVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  ulong local_48;
  
  iVar4 = (**(code **)(*(long *)this + 0x30))(this,dst,swizzle._M_len);
  iVar5 = (*(dst->super_Image)._vptr_Image[6])(dst);
  if (iVar4 != iVar5) {
    __assert_fail("getComponentSize() == dst.getComponentSize()",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/imageio/./image.hpp"
                  ,0x50a,
                  "ImageT<componentType, componentCount> &ImageT<unsigned char, 2>::copyTo(DstImage &, std::string_view) [componentType = unsigned char, componentCount = 2, DstImage = ImageT<unsigned char, 4>]"
                 );
  }
  if ((*(uint32_t *)(this + 8) != (dst->super_Image).width) ||
     (*(uint32_t *)(this + 0xc) != (dst->super_Image).height)) {
    __assert_fail("width == dst.getWidth() && height == dst.getHeight()",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/imageio/./image.hpp"
                  ,0x50b,
                  "ImageT<componentType, componentCount> &ImageT<unsigned char, 2>::copyTo(DstImage &, std::string_view) [componentType = unsigned char, componentCount = 2, DstImage = ImageT<unsigned char, 4>]"
                 );
  }
  uVar1 = *(undefined8 *)(this + 0x10);
  (dst->super_Image).transferFunction = (int)uVar1;
  (dst->super_Image).primaries = (int)((ulong)uVar1 >> 0x20);
  if (*(int *)(this + 0xc) * *(int *)(this + 8) != 0) {
    lVar10 = 0;
    local_48 = 0;
    do {
      iVar4 = (*(dst->super_Image)._vptr_Image[5])(dst);
      uVar6 = 0;
      if (iVar4 != 0) {
        uVar9 = 0;
        do {
          uVar6 = (**(code **)(*(long *)this + 0x28))(this);
          if (uVar6 <= uVar9) break;
          pCVar2 = dst->pixels;
          uVar3 = ImageT<unsigned_char,_2U>::swizzlePixel
                            ((ImageT<unsigned_char,_2U> *)this,
                             (Color *)(*(long *)(this + 0x18) + local_48 * 2),swizzle._M_str[uVar9])
          ;
          uVar8 = 3;
          if ((uint)uVar9 < 3) {
            uVar8 = uVar9 & 0xffffffff;
          }
          pCVar2[local_48].field_0.comps[uVar8] = uVar3;
          uVar9 = uVar9 + 1;
          uVar6 = (*(dst->super_Image)._vptr_Image[5])(dst);
        } while (uVar9 < uVar6);
        uVar6 = (uint)uVar9;
      }
      uVar7 = (*(dst->super_Image)._vptr_Image[5])(dst);
      if (uVar6 < uVar7) {
        uVar9 = (ulong)uVar6;
        do {
          if (uVar9 < 3) {
            (dst->pixels->field_0).comps[uVar9 + lVar10] = '\0';
          }
          else {
            dst->pixels[local_48].field_0.comps[3] = 0xff;
          }
          uVar9 = uVar9 + 1;
          uVar6 = (*(dst->super_Image)._vptr_Image[5])(dst);
        } while (uVar9 < uVar6);
      }
      local_48 = local_48 + 1;
      lVar10 = lVar10 + 4;
    } while (local_48 < (uint)(*(int *)(this + 0xc) * *(int *)(this + 8)));
  }
  return (ImageT<unsigned_char,_2U> *)this;
}

Assistant:

ImageT& copyTo(DstImage& dst, std::string_view swizzle) {
        assert(getComponentSize() == dst.getComponentSize());
        assert(width == dst.getWidth() && height == dst.getHeight());

        dst.setTransferFunction(transferFunction);
        dst.setPrimaries(primaries);
        for (size_t i = 0; i < getPixelCount(); i++) {
            uint32_t c;
            for (c = 0; c < dst.getComponentCount(); c++) {
                if (c < getComponentCount())
                    dst.pixels[i].set(c, swizzlePixel(pixels[i], swizzle[c]));
                else
                    break;
            }
            for (; c < dst.getComponentCount(); c++)
                if (c < 3)
                    dst.pixels[i].set(c, componentType{0});
                else
                    dst.pixels[i].set(c, Color::one());
        }
        return *this;
    }